

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_container * cram_read_container(cram_fd *fd)

{
  int32_t *piVar1;
  byte bVar11;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar12;
  uint32_t uVar8;
  cram_container *c;
  int32_t *piVar9;
  int *piVar10;
  byte bVar13;
  byte bVar14;
  byte *pbVar15;
  long lVar16;
  size_t sVar17;
  int32_t iVar18;
  long lVar19;
  ulong uVar20;
  long lStack_2a0;
  int32_t i32;
  int32_t local_280;
  int32_t local_27c;
  int32_t local_278;
  int32_t local_274;
  int64_t local_270 [2];
  int32_t local_260;
  int32_t local_25c;
  int32_t local_258 [138];
  
  fd->err = 0;
  fd->eof = 0;
  memset(&local_280,0,0x250);
  if ((fd->version & 0xffffff00U) == 0x100) {
    uVar2 = itf8_decode(fd,&local_280);
    if (uVar2 == 0xffffffff) {
      fd->eof = (fd->empty_container == 0) + 1;
      return (cram_container *)0x0;
    }
  }
  else {
    uVar2 = int32_decode(fd,&local_280);
    if (uVar2 == 0xffffffff) {
      if (fd->version == 0x200) {
        iVar7 = 1;
      }
      else {
        iVar7 = (fd->empty_container == 0) + 1;
      }
      fd->eof = iVar7;
      return (cram_container *)0x0;
    }
  }
  uVar3 = itf8_decode(fd,&local_27c);
  if (uVar3 != 0xffffffff) {
    uVar4 = itf8_decode(fd,&local_278);
    if (((uVar4 != 0xffffffff) && (uVar5 = itf8_decode(fd,&local_274), uVar5 != 0xffffffff)) &&
       (uVar6 = itf8_decode(fd,&local_260), uVar6 != 0xffffffff)) {
      lVar19 = (ulong)uVar6 + (ulong)uVar5 + (ulong)uVar4 + (ulong)uVar3 + (ulong)uVar2;
      iVar7 = fd->version >> 8;
      if (iVar7 == 1) {
        local_270[0] = 0;
        local_270[1] = 0;
      }
      else {
        if (iVar7 < 3) {
          uVar2 = itf8_decode(fd,&i32);
          if (uVar2 == 0xffffffff) {
            return (cram_container *)0x0;
          }
          local_270[0] = (int64_t)i32;
        }
        else {
          uVar2 = ltf8_decode(fd,local_270);
          if (uVar2 == 0xffffffff) {
            return (cram_container *)0x0;
          }
        }
        uVar3 = ltf8_decode(fd,local_270 + 1);
        if (uVar3 == 0xffffffff) {
          return (cram_container *)0x0;
        }
        lVar19 = lVar19 + (ulong)uVar3 + (ulong)uVar2;
      }
      uVar2 = itf8_decode(fd,&local_25c);
      if (((uVar2 != 0xffffffff) && (uVar3 = itf8_decode(fd,local_258), uVar3 != 0xffffffff)) &&
         (c = (cram_container *)calloc(1,0x250), c != (cram_container *)0x0)) {
        memcpy(c,&local_280,0x250);
        uVar20 = (ulong)c->num_landmarks;
        piVar9 = (int32_t *)malloc(uVar20 * 4);
        c->landmark = piVar9;
        if (uVar20 == 0 || piVar9 != (int32_t *)0x0) {
          sVar17 = lVar19 + (ulong)uVar3 + (ulong)uVar2;
          lVar16 = 0;
          for (lVar19 = 0; iVar18 = (int32_t)uVar20, lVar19 < iVar18; lVar19 = lVar19 + 1) {
            uVar2 = itf8_decode(fd,(int32_t *)((long)c->landmark + lVar16));
            if (uVar2 == 0xffffffff) goto LAB_001279a6;
            sVar17 = sVar17 + uVar2;
            uVar20 = (ulong)(uint)c->num_landmarks;
            lVar16 = lVar16 + 4;
          }
          if (fd->version < 0x300) {
LAB_00127f53:
            c->offset = sVar17;
            c->slices = (cram_slice **)0x0;
            c->curr_slice = 0;
            c->max_slice = iVar18;
            c->slice_rec = 0;
            c->max_rec = 0;
            c->curr_rec = 0;
            if (c->ref_seq_id == -2) {
              c->multi_seq = 1;
              fd->multi_seq = 1;
              uVar2 = 0;
            }
            else {
              uVar2 = 0;
              if ((c->ref_seq_id == -1) && (c->num_records == 0)) {
                uVar2 = (uint)(c->ref_seq_start == 0x454f46);
              }
            }
            fd->empty_container = uVar2;
            return c;
          }
          piVar9 = (int32_t *)malloc((long)(iVar18 * 5 + 0x32));
          if (piVar9 != (int32_t *)0x0) {
            iVar7 = int32_decode(fd,(int32_t *)&c->crc32);
            if (iVar7 == -1) {
              return (cram_container *)0x0;
            }
            *piVar9 = c->length;
            uVar2 = c->ref_seq_id;
            bVar13 = (byte)uVar2;
            if (uVar2 < 0x80) {
              *(byte *)(piVar9 + 1) = bVar13;
              lVar19 = 1;
            }
            else {
              bVar11 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x4000) {
                lVar19 = 2;
                *(byte *)(piVar9 + 1) = bVar11 | 0x80;
                *(byte *)((long)piVar9 + 5) = bVar13;
              }
              else {
                bVar12 = (byte)(uVar2 >> 0x10);
                if (uVar2 < 0x200000) {
                  lVar19 = 3;
                  *(byte *)(piVar9 + 1) = bVar12 | 0xc0;
                  *(byte *)((long)piVar9 + 5) = bVar11;
                  *(byte *)((long)piVar9 + 6) = bVar13;
                }
                else {
                  bVar14 = (byte)(uVar2 >> 0x18);
                  if (uVar2 < 0x10000000) {
                    lVar19 = 4;
                    *(byte *)(piVar9 + 1) = bVar14 | 0xe0;
                    *(byte *)((long)piVar9 + 5) = bVar12;
                    *(byte *)((long)piVar9 + 6) = bVar11;
                    *(byte *)((long)piVar9 + 7) = bVar13;
                  }
                  else {
                    lVar19 = 5;
                    *(byte *)(piVar9 + 1) = bVar14 >> 4 | 0xf0;
                    *(char *)((long)piVar9 + 5) = (char)(uVar2 >> 0x14);
                    *(char *)((long)piVar9 + 6) = (char)(uVar2 >> 0xc);
                    *(char *)((long)piVar9 + 7) = (char)(uVar2 >> 4);
                    *(byte *)(piVar9 + 2) = bVar13 & 0xf;
                  }
                }
              }
            }
            pbVar15 = (byte *)((long)(piVar9 + 1) + lVar19);
            uVar2 = c->ref_seq_start;
            bVar13 = (byte)uVar2;
            if (uVar2 < 0x80) {
              *pbVar15 = bVar13;
              lStack_2a0 = 1;
            }
            else {
              bVar11 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x4000) {
                *pbVar15 = bVar11 | 0x80;
                pbVar15[1] = bVar13;
                lStack_2a0 = 2;
              }
              else {
                bVar12 = (byte)(uVar2 >> 0x10);
                if (uVar2 < 0x200000) {
                  *pbVar15 = bVar12 | 0xc0;
                  pbVar15[1] = bVar11;
                  pbVar15[2] = bVar13;
                  lStack_2a0 = 3;
                }
                else {
                  bVar14 = (byte)(uVar2 >> 0x18);
                  if (uVar2 < 0x10000000) {
                    *pbVar15 = bVar14 | 0xe0;
                    pbVar15[1] = bVar12;
                    pbVar15[2] = bVar11;
                    pbVar15[3] = bVar13;
                    lStack_2a0 = 4;
                  }
                  else {
                    *pbVar15 = bVar14 >> 4 | 0xf0;
                    pbVar15[1] = (byte)(uVar2 >> 0x14);
                    pbVar15[2] = (byte)(uVar2 >> 0xc);
                    pbVar15[3] = (byte)(uVar2 >> 4);
                    pbVar15[4] = bVar13 & 0xf;
                    lStack_2a0 = 5;
                  }
                }
              }
            }
            pbVar15 = pbVar15 + lStack_2a0;
            uVar2 = c->ref_seq_span;
            bVar13 = (byte)uVar2;
            if (uVar2 < 0x80) {
              *pbVar15 = bVar13;
              lStack_2a0 = 1;
            }
            else {
              bVar11 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x4000) {
                *pbVar15 = bVar11 | 0x80;
                pbVar15[1] = bVar13;
                lStack_2a0 = 2;
              }
              else {
                bVar12 = (byte)(uVar2 >> 0x10);
                if (uVar2 < 0x200000) {
                  *pbVar15 = bVar12 | 0xc0;
                  pbVar15[1] = bVar11;
                  pbVar15[2] = bVar13;
                  lStack_2a0 = 3;
                }
                else {
                  bVar14 = (byte)(uVar2 >> 0x18);
                  if (uVar2 < 0x10000000) {
                    *pbVar15 = bVar14 | 0xe0;
                    pbVar15[1] = bVar12;
                    pbVar15[2] = bVar11;
                    pbVar15[3] = bVar13;
                    lStack_2a0 = 4;
                  }
                  else {
                    *pbVar15 = bVar14 >> 4 | 0xf0;
                    pbVar15[1] = (byte)(uVar2 >> 0x14);
                    pbVar15[2] = (byte)(uVar2 >> 0xc);
                    pbVar15[3] = (byte)(uVar2 >> 4);
                    pbVar15[4] = bVar13 & 0xf;
                    lStack_2a0 = 5;
                  }
                }
              }
            }
            pbVar15 = pbVar15 + lStack_2a0;
            uVar2 = c->num_records;
            bVar13 = (byte)uVar2;
            if (uVar2 < 0x80) {
              *pbVar15 = bVar13;
              lStack_2a0 = 1;
            }
            else {
              bVar11 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x4000) {
                *pbVar15 = bVar11 | 0x80;
                pbVar15[1] = bVar13;
                lStack_2a0 = 2;
              }
              else {
                bVar12 = (byte)(uVar2 >> 0x10);
                if (uVar2 < 0x200000) {
                  *pbVar15 = bVar12 | 0xc0;
                  pbVar15[1] = bVar11;
                  pbVar15[2] = bVar13;
                  lStack_2a0 = 3;
                }
                else {
                  bVar14 = (byte)(uVar2 >> 0x18);
                  if (uVar2 < 0x10000000) {
                    *pbVar15 = bVar14 | 0xe0;
                    pbVar15[1] = bVar12;
                    pbVar15[2] = bVar11;
                    pbVar15[3] = bVar13;
                    lStack_2a0 = 4;
                  }
                  else {
                    *pbVar15 = bVar14 >> 4 | 0xf0;
                    pbVar15[1] = (byte)(uVar2 >> 0x14);
                    pbVar15[2] = (byte)(uVar2 >> 0xc);
                    pbVar15[3] = (byte)(uVar2 >> 4);
                    pbVar15[4] = bVar13 & 0xf;
                    lStack_2a0 = 5;
                  }
                }
              }
            }
            uVar2 = ltf8_put((char *)(pbVar15 + lStack_2a0),c->record_counter);
            pbVar15 = pbVar15 + lStack_2a0 + uVar2;
            uVar20 = c->num_bases;
            bVar13 = (byte)uVar20;
            if (uVar20 < 0x80) {
              *pbVar15 = bVar13;
              lStack_2a0 = 1;
            }
            else {
              bVar11 = (byte)(uVar20 >> 0x18);
              bVar12 = (byte)(uVar20 >> 8);
              if (uVar20 < 0x4000) {
                *pbVar15 = bVar12 | 0x80;
                pbVar15[1] = bVar13;
                lStack_2a0 = 2;
              }
              else {
                bVar14 = (byte)(uVar20 >> 0x10);
                if (uVar20 < 0x200000) {
                  *pbVar15 = bVar14 | 0xc0;
                  pbVar15[1] = bVar12;
                  pbVar15[2] = bVar13;
                  lStack_2a0 = 3;
                }
                else if (uVar20 < 0x10000000) {
                  *pbVar15 = bVar11 | 0xe0;
                  pbVar15[1] = bVar14;
                  pbVar15[2] = bVar12;
                  pbVar15[3] = bVar13;
                  lStack_2a0 = 4;
                }
                else {
                  *pbVar15 = bVar11 >> 4 | 0xf0;
                  pbVar15[1] = (byte)(uVar20 >> 0x14);
                  pbVar15[2] = (byte)(uVar20 >> 0xc);
                  pbVar15[3] = (byte)(uVar20 >> 4);
                  pbVar15[4] = bVar13 & 0xf;
                  lStack_2a0 = 5;
                }
              }
            }
            pbVar15 = pbVar15 + lStack_2a0;
            uVar2 = c->num_blocks;
            bVar13 = (byte)uVar2;
            if (uVar2 < 0x80) {
              *pbVar15 = bVar13;
              lStack_2a0 = 1;
            }
            else {
              bVar11 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x4000) {
                *pbVar15 = bVar11 | 0x80;
                pbVar15[1] = bVar13;
                lStack_2a0 = 2;
              }
              else {
                bVar12 = (byte)(uVar2 >> 0x10);
                if (uVar2 < 0x200000) {
                  *pbVar15 = bVar12 | 0xc0;
                  pbVar15[1] = bVar11;
                  pbVar15[2] = bVar13;
                  lStack_2a0 = 3;
                }
                else {
                  bVar14 = (byte)(uVar2 >> 0x18);
                  if (uVar2 < 0x10000000) {
                    *pbVar15 = bVar14 | 0xe0;
                    pbVar15[1] = bVar12;
                    pbVar15[2] = bVar11;
                    pbVar15[3] = bVar13;
                    lStack_2a0 = 4;
                  }
                  else {
                    *pbVar15 = bVar14 >> 4 | 0xf0;
                    pbVar15[1] = (byte)(uVar2 >> 0x14);
                    pbVar15[2] = (byte)(uVar2 >> 0xc);
                    pbVar15[3] = (byte)(uVar2 >> 4);
                    pbVar15[4] = bVar13 & 0xf;
                    lStack_2a0 = 5;
                  }
                }
              }
            }
            pbVar15 = pbVar15 + lStack_2a0;
            uVar2 = c->num_landmarks;
            bVar13 = (byte)uVar2;
            if (uVar2 < 0x80) {
              *pbVar15 = bVar13;
              lStack_2a0 = 1;
            }
            else {
              bVar11 = (byte)(uVar2 >> 8);
              if (uVar2 < 0x4000) {
                *pbVar15 = bVar11 | 0x80;
                pbVar15[1] = bVar13;
                lStack_2a0 = 2;
              }
              else {
                bVar12 = (byte)(uVar2 >> 0x10);
                if (uVar2 < 0x200000) {
                  *pbVar15 = bVar12 | 0xc0;
                  pbVar15[1] = bVar11;
                  pbVar15[2] = bVar13;
                  lStack_2a0 = 3;
                }
                else {
                  bVar14 = (byte)(uVar2 >> 0x18);
                  if (uVar2 < 0x10000000) {
                    *pbVar15 = bVar14 | 0xe0;
                    pbVar15[1] = bVar12;
                    pbVar15[2] = bVar11;
                    pbVar15[3] = bVar13;
                    lStack_2a0 = 4;
                  }
                  else {
                    *pbVar15 = bVar14 >> 4 | 0xf0;
                    pbVar15[1] = (byte)(uVar2 >> 0x14);
                    pbVar15[2] = (byte)(uVar2 >> 0xc);
                    pbVar15[3] = (byte)(uVar2 >> 4);
                    pbVar15[4] = bVar13 & 0xf;
                    lStack_2a0 = 5;
                  }
                }
              }
            }
            sVar17 = sVar17 + 4;
            pbVar15 = pbVar15 + lStack_2a0;
            for (uVar20 = 0; uVar20 < uVar2; uVar20 = uVar20 + 1) {
              piVar1 = c->landmark;
              uVar2 = piVar1[uVar20];
              if (uVar2 < 0x80) {
                *pbVar15 = (byte)uVar2;
                lVar19 = 1;
              }
              else if (uVar2 < 0x4000) {
                *pbVar15 = (byte)(uVar2 >> 8) | 0x80;
                pbVar15[1] = *(byte *)(piVar1 + uVar20);
                lVar19 = 2;
              }
              else if (uVar2 < 0x200000) {
                *pbVar15 = (byte)(uVar2 >> 0x10) | 0xc0;
                pbVar15[1] = *(byte *)((long)piVar1 + uVar20 * 4 + 1);
                pbVar15[2] = *(byte *)(c->landmark + uVar20);
                lVar19 = 3;
              }
              else {
                bVar13 = (byte)(uVar2 >> 0x18);
                if (uVar2 < 0x10000000) {
                  *pbVar15 = bVar13 | 0xe0;
                  pbVar15[1] = *(byte *)((long)piVar1 + uVar20 * 4 + 2);
                  pbVar15[2] = *(byte *)((long)c->landmark + uVar20 * 4 + 1);
                  pbVar15[3] = *(byte *)(c->landmark + uVar20);
                  lVar19 = 4;
                }
                else {
                  *pbVar15 = bVar13 >> 4 | 0xf0;
                  pbVar15[1] = (byte)((uint)piVar1[uVar20] >> 0x14);
                  pbVar15[2] = (byte)((uint)c->landmark[uVar20] >> 0xc);
                  pbVar15[3] = (byte)((uint)c->landmark[uVar20] >> 4);
                  pbVar15[4] = *(byte *)(c->landmark + uVar20) & 0xf;
                  lVar19 = 5;
                }
              }
              pbVar15 = pbVar15 + lVar19;
              uVar2 = c->num_landmarks;
            }
            uVar8 = crc32(0,piVar9,(int)pbVar15 - (int)piVar9);
            if (c->crc32 == uVar8) {
              iVar18 = c->num_landmarks;
              goto LAB_00127f53;
            }
            fwrite("Container header CRC32 failure\n",0x1f,1,_stderr);
          }
        }
        else {
          piVar10 = __errno_location();
          fd->err = *piVar10;
        }
LAB_001279a6:
        cram_free_container(c);
      }
    }
  }
  return (cram_container *)0x0;
}

Assistant:

cram_container *cram_read_container(cram_fd *fd) {
    cram_container c2, *c;
    int i, s;
    size_t rd = 0;
    
    fd->err = 0;
    fd->eof = 0;

    memset(&c2, 0, sizeof(c2));
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if ((s = itf8_decode(fd, &c2.length)) == -1) {
	    fd->eof = fd->empty_container ? 1 : 2;
	    return NULL;
	} else {
	    rd+=s;
	}
    } else {
	if ((s = int32_decode(fd, &c2.length)) == -1) {
	    if (CRAM_MAJOR_VERS(fd->version) == 2 &&
		CRAM_MINOR_VERS(fd->version) == 0)
		fd->eof = 1; // EOF blocks arrived in v2.1
	    else
		fd->eof = fd->empty_container ? 1 : 2;
	    return NULL;
	} else {
	    rd+=s;
	}
    }
    if ((s = itf8_decode(fd, &c2.ref_seq_id))   == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.ref_seq_start))== -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.ref_seq_span)) == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.num_records))  == -1) return NULL; else rd+=s;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	c2.record_counter = 0;
	c2.num_bases = 0;
    } else {
	if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	    if ((s = ltf8_decode(fd, &c2.record_counter)) == -1)
		return NULL;
	    else
		rd += s;
	} else {
	    int32_t i32;
	    if ((s = itf8_decode(fd, &i32)) == -1)
		return NULL;
	    else
		rd += s;
	    c2.record_counter = i32;
	}

	if ((s = ltf8_decode(fd, &c2.num_bases))== -1)
	    return NULL;
	else
	    rd += s;
    }
    if ((s = itf8_decode(fd, &c2.num_blocks))   == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.num_landmarks))== -1) return NULL; else rd+=s;

    if (!(c = calloc(1, sizeof(*c))))
	return NULL;

    *c = c2;

    if (!(c->landmark = malloc(c->num_landmarks * sizeof(int32_t))) &&
	c->num_landmarks) {
	fd->err = errno;
	cram_free_container(c);
	return NULL;
    }  
    for (i = 0; i < c->num_landmarks; i++) {
	if ((s = itf8_decode(fd, &c->landmark[i])) == -1) {
	    cram_free_container(c);
	    return NULL;
	} else {
	    rd += s;
	}
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	uint32_t crc, i;
	unsigned char *dat = malloc(50 + 5*(c->num_landmarks)), *cp = dat;
	if (!dat) {
	    cram_free_container(c);
	    return NULL;
	}
	if (-1 == int32_decode(fd, (int32_t *)&c->crc32))
	    return NULL;
	else
	    rd+=4;

	/* Reencode first as we can't easily access the original byte stream.
	 *
	 * FIXME: Technically this means this may not be fool proof. We could
	 * create a CRAM file using a 2 byte ITF8 value that can fit in a 
	 * 1 byte field, meaning the encoding is different to the original
	 * form and so has a different CRC.
	 *
	 * The correct implementation would be to have an alternative form
	 * of itf8_decode which also squirrels away the raw byte stream
	 * during decoding so we can then CRC that.
	 */
	*(unsigned int *)cp = le_int4(c->length); cp += 4;
	cp += itf8_put(cp, c->ref_seq_id);
	cp += itf8_put(cp, c->ref_seq_start);
	cp += itf8_put(cp, c->ref_seq_span);
	cp += itf8_put(cp, c->num_records);
	cp += ltf8_put((char *)cp, c->record_counter);
	cp += itf8_put(cp, c->num_bases);
	cp += itf8_put(cp, c->num_blocks);
	cp += itf8_put(cp, c->num_landmarks);
	for (i = 0; i < c->num_landmarks; i++) {
	    cp += itf8_put(cp, c->landmark[i]);
	}

	crc = crc32(0L, dat, cp-dat);
	if (crc != c->crc32) {
	    fprintf(stderr, "Container header CRC32 failure\n");
	    cram_free_container(c);
	    return NULL;
	}
    }

    c->offset = rd;
    c->slices = NULL;
    c->curr_slice = 0;
    c->max_slice = c->num_landmarks;
    c->slice_rec = 0;
    c->curr_rec = 0;
    c->max_rec = 0;

    if (c->ref_seq_id == -2) {
	c->multi_seq = 1;
	fd->multi_seq = 1;
    }

    fd->empty_container =
	(c->num_records == 0 &&
	 c->ref_seq_id == -1 &&
	 c->ref_seq_start == 0x454f46 /* EOF */) ? 1 : 0;

    return c;
}